

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEquipment.cpp
# Opt level: O0

Watt __thiscall CompositeEquipment::Power(CompositeEquipment *this)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  int local_1c;
  Watt total;
  Iterator<Equipment_*> *i;
  CompositeEquipment *this_local;
  long *plVar3;
  
  iVar2 = (*(this->super_Equipment)._vptr_Equipment[7])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  (**(code **)*plVar3)();
  while( true ) {
    bVar1 = (**(code **)(*plVar3 + 0x10))();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    plVar4 = (long *)(**(code **)(*plVar3 + 0x18))();
    iVar2 = (**(code **)(*plVar4 + 0x10))();
    local_1c = iVar2 + local_1c;
    (**(code **)(*plVar3 + 8))();
  }
  if (plVar3 != (long *)0x0) {
    operator_delete(plVar3);
  }
  return local_1c;
}

Assistant:

Watt CompositeEquipment::Power() {
    Iterator<Equipment*>* i = CreateIterator(); // ERRATUM: book had different iterator.
    Watt total = 0;

    for (i->First(); !i->IsDone(); i->Next()) {
        total += i->CurrentItem()->Power();
    }
    delete i;
    return total;
}